

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxGetDefaultByType::Emit(FxGetDefaultByType *this,VMFunctionBuilder *build)

{
  uint uVar1;
  ExpEmit EVar2;
  ExpEmit EVar3;
  uint opa;
  ExpEmit local_30;
  uint extraout_var;
  
  EVar2._0_4_ = (*this->Self->_vptr_FxExpression[9])();
  EVar2.Konst = (bool)(char)extraout_var;
  EVar2.Fixed = (bool)(char)(extraout_var >> 8);
  EVar2.Final = (bool)(char)(extraout_var >> 0x10);
  EVar2.Target = (bool)(char)(extraout_var >> 0x18);
  local_30 = EVar2;
  ExpEmit::Free(&local_30,build);
  uVar1 = VMFunctionBuilder::RegAvailability::Get(build->Registers + 3,1);
  opa = uVar1 & 0xffff;
  if ((extraout_var & 1) != 0) {
    VMFunctionBuilder::Emit(build,5,opa,(VM_SHALF)EVar2._0_4_);
    EVar2.Konst = false;
    EVar2.Fixed = false;
    EVar2.Final = false;
    EVar2.Target = false;
    EVar2.RegNum = (short)uVar1;
    EVar2.RegType = (char)(uVar1 >> 0x10);
    EVar2.RegCount = (char)(uVar1 >> 0x18);
  }
  EVar3.Konst = false;
  EVar3.Fixed = false;
  EVar3.Final = false;
  EVar3.Target = false;
  EVar3._0_4_ = opa + 0x1030000;
  uVar1 = VMFunctionBuilder::GetConstantInt(build,0xe8);
  VMFunctionBuilder::Emit(build,0x1c,opa,EVar2._0_4_ & 0xffff,uVar1);
  return EVar3;
}

Assistant:

ExpEmit FxGetDefaultByType::Emit(VMFunctionBuilder *build)
{
	ExpEmit op = Self->Emit(build);
	op.Free(build);
	ExpEmit to(build, REGT_POINTER);
	if (op.Konst)
	{
		build->Emit(OP_LKP, to.RegNum, op.RegNum);
		op = to;
	}
	build->Emit(OP_LO, to.RegNum, op.RegNum, build->GetConstantInt(myoffsetof(PClass, Defaults)));
	return to;
}